

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  ulong uVar1;
  char *pcVar2;
  cmGlobalGenerator *gen_local;
  cmGlobalGenerator *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)&this->ConfiguredFilesPath,(string *)&gen->ConfiguredFilesPath);
  }
  else {
    pcVar2 = cmake::GetHomeOutputDirectory(gen->CMakeInstance);
    std::__cxx11::string::operator=((string *)&this->ConfiguredFilesPath,pcVar2);
    pcVar2 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)&this->ConfiguredFilesPath,pcVar2);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath = gen->CMakeInstance->GetHomeOutputDirectory();
    this->ConfiguredFilesPath += cmake::GetCMakeFilesDirectory();
  }
}